

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<tinyusdz::value::vector3h>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,vector3h *v)

{
  half hVar1;
  bool bVar2;
  value_type *pvVar3;
  optional<tinyusdz::value::vector3h> local_5c;
  optional<tinyusdz::value::vector3h> local_54;
  optional<tinyusdz::value::vector3h> pv_1;
  optional<tinyusdz::value::vector3h> local_40;
  optional<tinyusdz::value::vector3h> pv;
  vector3h *v_local;
  TimeSampleInterpolationType tinterp_local;
  double t_local;
  PrimVar *this_local;
  
  if (v == (vector3h *)0x0) {
    this_local._7_1_ = 0;
    goto LAB_002e94e4;
  }
  tinyusdz::value::TimeCode::TimeCode((TimeCode *)&pv,t);
  bVar2 = tinyusdz::value::TimeCode::is_default((TimeCode *)&pv);
  if (bVar2) {
    get_default_value<tinyusdz::value::vector3h>
              ((optional<tinyusdz::value::vector3h> *)((long)&pv_1.contained + 2),this);
    nonstd::optional_lite::optional<tinyusdz::value::vector3h>::
    optional<tinyusdz::value::vector3h,_0>
              (&local_40,(optional<tinyusdz::value::vector3h> *)((long)&pv_1.contained + 2));
    nonstd::optional_lite::optional<tinyusdz::value::vector3h>::~optional
              ((optional<tinyusdz::value::vector3h> *)((long)&pv_1.contained + 2));
    pv_1.has_value_ = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_40);
    if (pv_1.has_value_) {
      pvVar3 = nonstd::optional_lite::optional<tinyusdz::value::vector3h>::value(&local_40);
      hVar1.value = (pvVar3->y).value;
      v->x = (half)(pvVar3->x).value;
      v->y = (half)hVar1.value;
      (v->z).value = (pvVar3->z).value;
      this_local._7_1_ = 1;
    }
    pv_1._1_3_ = 0;
    nonstd::optional_lite::optional<tinyusdz::value::vector3h>::~optional(&local_40);
    if (pv_1._0_4_ != 0) goto LAB_002e94e4;
    bVar2 = tinyusdz::value::TimeSamples::empty(&this->_ts);
    if (bVar2) {
      this_local._7_1_ = 0;
      goto LAB_002e94e4;
    }
  }
  bVar2 = has_timesamples(this);
  if (bVar2) {
    this_local._7_1_ =
         tinyusdz::value::TimeSamples::get<tinyusdz::value::vector3h,_nullptr>
                   (&this->_ts,v,t,tinterp);
  }
  else {
    bVar2 = has_default(this);
    if (bVar2) {
      get_default_value<tinyusdz::value::vector3h>(&local_5c,this);
      nonstd::optional_lite::optional<tinyusdz::value::vector3h>::
      optional<tinyusdz::value::vector3h,_0>(&local_54,&local_5c);
      nonstd::optional_lite::optional<tinyusdz::value::vector3h>::~optional(&local_5c);
      bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_54);
      if (bVar2) {
        pvVar3 = nonstd::optional_lite::optional<tinyusdz::value::vector3h>::value(&local_54);
        hVar1.value = (pvVar3->y).value;
        v->x = (half)(pvVar3->x).value;
        v->y = (half)hVar1.value;
        (v->z).value = (pvVar3->z).value;
        this_local._7_1_ = 1;
      }
      pv_1._1_3_ = 0;
      pv_1.has_value_ = bVar2;
      nonstd::optional_lite::optional<tinyusdz::value::vector3h>::~optional(&local_54);
      if (pv_1._0_4_ != 0) goto LAB_002e94e4;
    }
    this_local._7_1_ = 0;
  }
LAB_002e94e4:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }